

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_0::isSSOCompatibleInterpolation
               (VaryingInterpolation vertexInterpolation,VaryingInterpolation fragmentInterpolation)

{
  undefined1 local_14;
  undefined1 local_13;
  bool isSmoothFrag;
  bool isSmoothVtx;
  VaryingInterpolation fragmentInterpolation_local;
  VaryingInterpolation vertexInterpolation_local;
  
  local_13 = true;
  if ((vertexInterpolation != VARYINGINTERPOLATION_SMOOTH) &&
     (local_13 = true, vertexInterpolation != VARYINGINTERPOLATION_DEFAULT)) {
    local_13 = vertexInterpolation == VARYINGINTERPOLATION_CENTROID;
  }
  local_14 = true;
  if ((fragmentInterpolation != VARYINGINTERPOLATION_SMOOTH) &&
     (local_14 = true, fragmentInterpolation != VARYINGINTERPOLATION_DEFAULT)) {
    local_14 = fragmentInterpolation == VARYINGINTERPOLATION_CENTROID;
  }
  return local_13 == local_14;
}

Assistant:

bool isSSOCompatibleInterpolation (VaryingInterpolation vertexInterpolation, VaryingInterpolation fragmentInterpolation)
{
	// interpolations must be fully specified
	DE_ASSERT(vertexInterpolation != VARYINGINTERPOLATION_RANDOM);
	DE_ASSERT(vertexInterpolation < VARYINGINTERPOLATION_LAST);
	DE_ASSERT(fragmentInterpolation != VARYINGINTERPOLATION_RANDOM);
	DE_ASSERT(fragmentInterpolation < VARYINGINTERPOLATION_LAST);

	// interpolation can only be either smooth or flat. Auxiliary storage does not matter.
	const bool isSmoothVtx =    (vertexInterpolation == VARYINGINTERPOLATION_SMOOTH)      || //!< trivial
	                            (vertexInterpolation == VARYINGINTERPOLATION_DEFAULT)     || //!< default to smooth
	                            (vertexInterpolation == VARYINGINTERPOLATION_CENTROID);      //!< default to smooth, ignore storage
	const bool isSmoothFrag =   (fragmentInterpolation == VARYINGINTERPOLATION_SMOOTH)    || //!< trivial
	                            (fragmentInterpolation == VARYINGINTERPOLATION_DEFAULT)   || //!< default to smooth
	                            (fragmentInterpolation == VARYINGINTERPOLATION_CENTROID);    //!< default to smooth, ignore storage
	// Khronos bug #12630: flat / smooth qualifiers must match in SSO
	return isSmoothVtx == isSmoothFrag;
}